

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O0

void Centaurus::SkipRoutineEM64T<wchar_t>::emit(X86Assembler *as)

{
  anon_union_16_7_ed616b9d_for_Operand__0 *o1;
  Operand_ *in_stack_fffffffffffffde0;
  undefined8 this;
  undefined8 in_stack_fffffffffffffde8;
  undefined8 uVar1;
  uint32_t uVar2;
  CodeEmitter *in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffdf8;
  int o1_00;
  undefined8 uVar3;
  uint32_t o1_01;
  undefined8 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe0c;
  undefined8 in_stack_fffffffffffffe10;
  Imm local_1e0;
  Imm local_1d0;
  anon_union_16_7_ed616b9d_for_Operand__0 local_1c0;
  undefined1 local_1b0 [8];
  Label looplabel;
  X86Assembler *as_local;
  uint32_t signature;
  
  uVar2 = (uint32_t)((ulong)in_stack_fffffffffffffde8 >> 0x20);
  o1_00 = (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  looplabel.super_Operand.super_Operand_.field_0._mem.field_2 =
       (anon_union_8_2_78723da6_for_MemData_2)as;
  (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])(local_1b0);
  (**(code **)(*(long *)looplabel.super_Operand.super_Operand_.field_0._mem.field_2 + 0x48))
            (looplabel.super_Operand.super_Operand_.field_0._mem.field_2,local_1b0);
  o1 = &local_1c0;
  local_1c0._packed[0] = (UInt64)1.65781168201985e-316;
  local_1c0._any.reserved12_4 = 6;
  local_1c0._any.reserved8_4 = 0;
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffffdf0,uVar2,in_stack_fffffffffffffde0,(Operand_ *)&o1->_any);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,
             (Operand_ *)in_stack_fffffffffffffe00,o1_00);
  this = looplabel.super_Operand.super_Operand_.field_0._mem.field_2;
  asmjit::Imm::Imm(&local_1d0,0x20);
  asmjit::CodeEmitter::emit(in_stack_fffffffffffffdf0,uVar2,(Operand_ *)this,(Operand_ *)&o1->_any);
  asmjit::CodeEmitter::emit((CodeEmitter *)this,(uint32_t)((ulong)o1 >> 0x20),(Operand_ *)0x16dc41);
  uVar1 = looplabel.super_Operand.super_Operand_.field_0._mem.field_2;
  asmjit::Imm::Imm(&local_1e0,9);
  uVar2 = SUB84(uVar1,4);
  asmjit::CodeEmitter::emit(in_stack_fffffffffffffdf0,uVar2,(Operand_ *)this,(Operand_ *)&o1->_any);
  asmjit::CodeEmitter::emit((CodeEmitter *)this,(uint32_t)((ulong)o1 >> 0x20),(Operand_ *)0x16dce3);
  uVar1 = looplabel.super_Operand.super_Operand_.field_0._mem.field_2;
  asmjit::Imm::Imm((Imm *)&stack0xfffffffffffffe10,10);
  asmjit::CodeEmitter::emit((CodeEmitter *)uVar1,uVar2,(Operand_ *)this,(Operand_ *)&o1->_any);
  asmjit::CodeEmitter::emit((CodeEmitter *)this,(uint32_t)((ulong)o1 >> 0x20),(Operand_ *)0x16dd85);
  uVar3 = looplabel.super_Operand.super_Operand_.field_0._mem.field_2;
  asmjit::Imm::Imm((Imm *)&stack0xfffffffffffffe00,0xd);
  o1_01 = SUB84(uVar3,4);
  asmjit::CodeEmitter::emit((CodeEmitter *)uVar1,uVar2,(Operand_ *)this,(Operand_ *)&o1->_any);
  asmjit::CodeEmitter::emit((CodeEmitter *)this,(uint32_t)((ulong)o1 >> 0x20),(Operand_ *)0x16de27);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,
             (Operand_ *)in_stack_fffffffffffffe00,o1_01);
  return;
}

Assistant:

void SkipRoutineEM64T<TCHAR>::emit(asmjit::X86Assembler& as)
{
    asmjit::Label looplabel = as.newLabel();

    as.bind(looplabel);

    //Read the character from stream and advance the input position
    if (sizeof(TCHAR) == 1)
        as.movzx(CHAR_REG, asmjit::x86::byte_ptr(INPUT_REG, 0));
    else
        as.movzx(CHAR_REG, asmjit::x86::word_ptr(INPUT_REG, 0));
    if (sizeof(TCHAR) == 1)
        as.inc(INPUT_REG);
    else
        as.add(INPUT_REG, 2);

    as.cmp(CHAR_REG, asmjit::Imm(' '));
    as.je(looplabel);
    as.cmp(CHAR_REG, asmjit::Imm('\t'));
    as.je(looplabel);
    as.cmp(CHAR_REG, asmjit::Imm('\n'));
    as.je(looplabel);
    as.cmp(CHAR_REG, asmjit::Imm('\r'));
    as.je(looplabel);

    if (sizeof(TCHAR) == 1)
        as.dec(INPUT_REG);
    else
        as.sub(INPUT_REG, 2);

    /*as.movdqu(LOAD_REG, asmjit::X86Mem(INPUT_REG, 0));
    as.pcmpistri(PATTERN_REG, LOAD_REG, asmjit::Imm(sizeof(TCHAR) == 1 ? 0x14 : 0x15));
    if (sizeof(TCHAR) == 2)
        as.sal(INDEX_REG, 1);
    as.add(INPUT_REG, INDEX_REG);
    as.cmp(INDEX_REG, 15);
    as.jg(looplabel);*/
}